

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runner.h
# Opt level: O1

ostream * operator<<(ostream *os,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *v)

{
  pointer pbVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  pointer pbVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pbVar3 = (v->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (v->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    bVar2 = true;
    do {
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
      pbVar3 = pbVar3 + 1;
      bVar2 = false;
    } while (pbVar3 != pbVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

ostream& operator << (ostream& os, const vector<T>& v) {
    os << "[";   
    bool first = true;
    
    for (const auto& x : v) {
        if (!first) {
            os << ", ";
        }

        first = false;
        os << x;
    }

    return os << "]";
}